

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON::GetFileStats(FILE *fp,size_t *filesize,time_t *create_time,time_t *lastmodify_time)

{
  int iVar1;
  undefined1 local_c0 [4];
  int fstat_rc;
  stat sb;
  int fd;
  bool rc;
  time_t *lastmodify_time_local;
  time_t *create_time_local;
  size_t *filesize_local;
  FILE *fp_local;
  
  sb.__glibc_reserved[2]._7_1_ = 0;
  if (filesize != (size_t *)0x0) {
    *filesize = 0;
  }
  if (create_time != (time_t *)0x0) {
    *create_time = 0;
  }
  if (lastmodify_time != (time_t *)0x0) {
    *lastmodify_time = 0;
  }
  if (fp != (FILE *)0x0) {
    sb.__glibc_reserved[2]._0_4_ = fileno((FILE *)fp);
    memset(local_c0,0,0x90);
    iVar1 = fstat((int)sb.__glibc_reserved[2],(stat *)local_c0);
    if (iVar1 == 0) {
      if (filesize != (size_t *)0x0) {
        *filesize = sb.st_rdev;
      }
      if (create_time != (time_t *)0x0) {
        *create_time = sb.st_mtim.tv_nsec;
      }
      if (lastmodify_time != (time_t *)0x0) {
        *lastmodify_time = sb.st_atim.tv_nsec;
      }
      sb.__glibc_reserved[2]._7_1_ = 1;
    }
  }
  return (bool)(sb.__glibc_reserved[2]._7_1_ & 1);
}

Assistant:

bool ON::GetFileStats( FILE* fp,
                       size_t* filesize,
                       time_t* create_time,
                       time_t* lastmodify_time
                      )
{
  bool rc = false;

  if (filesize)
    *filesize = 0;
  if (create_time)
    *create_time = 0;
  if (lastmodify_time)
    *lastmodify_time = 0;

  if ( fp )
  {

#if defined(ON_COMPILER_MSC)

    // Microsoft compilers
    int fd = _fileno(fp);    
#if (_MSC_VER >= 1400)
    // VC 8 (2005) 
    // works for file sizes > 4GB 
    // when size_t is a 64 bit integer
    struct _stat64 sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = _fstat64(fd, &sb);
#else
    // VC6 compiler
    // works on most compilers
    struct _stat sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = _fstat(fd, &sb);
#endif

#else
    // works on most compilers
    int fd = fileno(fp);
    struct stat sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = fstat(fd, &sb);
#endif


    if (0 == fstat_rc)
    {
      if (filesize)
        *filesize = (size_t)sb.st_size;
      if (create_time)
        *create_time = (time_t)sb.st_ctime;
      if (lastmodify_time)
        *lastmodify_time = (time_t)sb.st_mtime;
      rc = true;
    }
  }

  return rc;
}